

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIError.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampSamplerParameterIErrorTest::VerifyGLSamplerParameterIiv
          (TextureBorderClampSamplerParameterIErrorTest *this,GLuint sampler_id,GLenum pname,
          GLint *params,GLenum expected_error)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  long local_30;
  Functions *gl;
  GLenum error_code;
  GLenum expected_error_local;
  GLint *params_local;
  GLenum pname_local;
  GLuint sampler_id_local;
  TextureBorderClampSamplerParameterIErrorTest *this_local;
  
  gl._0_4_ = 0;
  gl._4_4_ = expected_error;
  _error_code = params;
  params_local._0_4_ = pname;
  params_local._4_4_ = sampler_id;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_30 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_30 + 0x1260))(params_local._4_4_,(GLenum)params_local,_error_code);
  gl._0_4_ = (**(code **)(local_30 + 0x800))();
  if (gl._4_4_ != (GLenum)gl) {
    this->m_test_passed = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [36])"glSamplerParameterIivEXT() failed:[");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])"sampler id:");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&params_local + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", pname:");
    local_1c8[0] = TextureBorderClampBase::getPNameString
                             (&this->super_TextureBorderClampBase,(GLenum)params_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])"] reported error code:[");
    EVar4 = glu::getErrorStr((GLenum)gl);
    local_1e8 = EVar4.m_getName;
    local_1e0 = EVar4.m_value;
    local_1d8.m_getName = local_1e8;
    local_1d8.m_value = local_1e0;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])"] expected error code:[");
    EVar4 = glu::getErrorStr(gl._4_4_);
    local_1f8.m_getName = EVar4.m_getName;
    local_1f8.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b2eb07);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIErrorTest::VerifyGLSamplerParameterIiv(glw::GLuint sampler_id,
																			   glw::GLenum pname, glw::GLint* params,
																			   glw::GLenum expected_error)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	gl.samplerParameterIiv(sampler_id, pname, params);

	error_code = gl.getError();
	if (expected_error != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glSamplerParameterIivEXT() failed:["
						   << "sampler id:" << sampler_id << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}